

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complex_tree.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool local_212;
  bool local_211;
  bool local_210;
  bool local_20f;
  bool local_20e;
  bool local_20d;
  int local_20c [2];
  bool local_202;
  bool local_201;
  int local_200;
  bool local_1fa;
  bool local_1f9;
  int local_1f8 [2];
  bool local_1ee;
  bool local_1ed;
  int local_1ec;
  bool local_1e6;
  bool local_1e5;
  int local_1e4 [3];
  bool local_1d6;
  bool local_1d5;
  int local_1d4;
  bool local_1ce;
  bool local_1cd;
  int local_1cc [5];
  bool local_1b6;
  bool local_1b5;
  int local_1b4;
  bool local_1ae;
  bool local_1ad;
  int local_1ac [8];
  bool local_18a;
  bool local_189;
  int local_188;
  bool local_182;
  bool local_181;
  int local_180 [2];
  anon_class_8_1_ba9a1774 local_178;
  anon_class_8_1_ba9a1774 redoAll;
  anon_class_8_1_ba9a1774 undoAll;
  int local_160 [8];
  bool local_13e;
  bool local_13d;
  int local_13c [9];
  undefined1 local_118 [8];
  UndoHistory history;
  Cmd cmd8;
  Cmd cmd7;
  Cmd cmd6;
  Cmd cmd5;
  Cmd cmd4;
  Cmd cmd3;
  undefined1 local_50 [8];
  Cmd cmd2;
  Cmd cmd1;
  int model;
  char **argv_local;
  int argc_local;
  
  cmd1.m_undo_value = 0;
  Cmd::Cmd((Cmd *)&cmd2.m_redo_value,&cmd1.m_undo_value,1,0);
  Cmd::Cmd((Cmd *)local_50,&cmd1.m_undo_value,2,1);
  Cmd::Cmd((Cmd *)&cmd4.m_redo_value,&cmd1.m_undo_value,3,2);
  Cmd::Cmd((Cmd *)&cmd5.m_redo_value,&cmd1.m_undo_value,4,3);
  Cmd::Cmd((Cmd *)&cmd6.m_redo_value,&cmd1.m_undo_value,5,2);
  Cmd::Cmd((Cmd *)&cmd7.m_redo_value,&cmd1.m_undo_value,6,5);
  Cmd::Cmd((Cmd *)&cmd8.m_redo_value,&cmd1.m_undo_value,7,5);
  Cmd::Cmd((Cmd *)&history.m_cur,&cmd1.m_undo_value,8,7);
  undo::UndoHistory::UndoHistory((UndoHistory *)local_118,(UndoHistoryDelegate *)0x0);
  Cmd::redo((Cmd *)&cmd2.m_redo_value);
  undo::UndoHistory::add((UndoHistory *)local_118,(UndoCommand *)&cmd2.m_redo_value);
  Cmd::redo((Cmd *)local_50);
  undo::UndoHistory::add((UndoHistory *)local_118,(UndoCommand *)local_50);
  Cmd::redo((Cmd *)&cmd4.m_redo_value);
  undo::UndoHistory::add((UndoHistory *)local_118,(UndoCommand *)&cmd4.m_redo_value);
  Cmd::redo((Cmd *)&cmd5.m_redo_value);
  undo::UndoHistory::add((UndoHistory *)local_118,(UndoCommand *)&cmd5.m_redo_value);
  undo::UndoHistory::undo((UndoHistory *)local_118);
  undo::UndoHistory::undo((UndoHistory *)local_118);
  Cmd::redo((Cmd *)&cmd6.m_redo_value);
  undo::UndoHistory::add((UndoHistory *)local_118,(UndoCommand *)&cmd6.m_redo_value);
  Cmd::redo((Cmd *)&cmd7.m_redo_value);
  undo::UndoHistory::add((UndoHistory *)local_118,(UndoCommand *)&cmd7.m_redo_value);
  undo::UndoHistory::undo((UndoHistory *)local_118);
  Cmd::redo((Cmd *)&cmd8.m_redo_value);
  undo::UndoHistory::add((UndoHistory *)local_118,(UndoCommand *)&cmd8.m_redo_value);
  Cmd::redo((Cmd *)&history.m_cur);
  undo::UndoHistory::add((UndoHistory *)local_118,(UndoCommand *)&history.m_cur);
  local_13c[8] = 8;
  expect_eq<int,int>(local_13c + 8,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x2a);
  undo::UndoHistory::undo((UndoHistory *)local_118);
  local_13c[7] = 7;
  expect_eq<int,int>(local_13c + 7,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x2b);
  undo::UndoHistory::undo((UndoHistory *)local_118);
  local_13c[6] = 6;
  expect_eq<int,int>(local_13c + 6,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x2c);
  undo::UndoHistory::undo((UndoHistory *)local_118);
  local_13c[5] = 5;
  expect_eq<int,int>(local_13c + 5,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x2d);
  undo::UndoHistory::undo((UndoHistory *)local_118);
  local_13c[4] = 4;
  expect_eq<int,int>(local_13c + 4,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x2e);
  undo::UndoHistory::undo((UndoHistory *)local_118);
  local_13c[3] = 3;
  expect_eq<int,int>(local_13c + 3,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x2f);
  undo::UndoHistory::undo((UndoHistory *)local_118);
  local_13c[2] = 2;
  expect_eq<int,int>(local_13c + 2,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x30);
  undo::UndoHistory::undo((UndoHistory *)local_118);
  local_13c[1] = 1;
  expect_eq<int,int>(local_13c + 1,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x31);
  undo::UndoHistory::undo((UndoHistory *)local_118);
  local_13c[0] = 0;
  expect_eq<int,int>(local_13c,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x32);
  local_13d = false;
  local_13e = undo::UndoHistory::canUndo((UndoHistory *)local_118);
  expect_eq<bool,bool>
            (&local_13d,&local_13e,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x33);
  undo::UndoHistory::redo((UndoHistory *)local_118);
  local_160[7] = 1;
  expect_eq<int,int>(local_160 + 7,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x35);
  undo::UndoHistory::redo((UndoHistory *)local_118);
  local_160[6] = 2;
  expect_eq<int,int>(local_160 + 6,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x36);
  undo::UndoHistory::redo((UndoHistory *)local_118);
  local_160[5] = 3;
  expect_eq<int,int>(local_160 + 5,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x37);
  undo::UndoHistory::redo((UndoHistory *)local_118);
  local_160[4] = 4;
  expect_eq<int,int>(local_160 + 4,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x38);
  undo::UndoHistory::redo((UndoHistory *)local_118);
  local_160[3] = 5;
  expect_eq<int,int>(local_160 + 3,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x39);
  undo::UndoHistory::redo((UndoHistory *)local_118);
  local_160[2] = 6;
  expect_eq<int,int>(local_160 + 2,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x3a);
  undo::UndoHistory::redo((UndoHistory *)local_118);
  local_160[1] = 7;
  expect_eq<int,int>(local_160 + 1,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x3b);
  undo::UndoHistory::redo((UndoHistory *)local_118);
  local_160[0] = 8;
  expect_eq<int,int>(local_160,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x3c);
  undoAll.history._7_1_ = 0;
  undoAll.history._6_1_ = undo::UndoHistory::canRedo((UndoHistory *)local_118);
  expect_eq<bool,bool>
            ((bool *)((long)&undoAll.history + 7),(bool *)((long)&undoAll.history + 6),
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x3d);
  local_178.history = (UndoHistory *)local_118;
  redoAll.history = local_178.history;
  main::anon_class_8_1_ba9a1774::operator()(&redoAll);
  local_180[1] = 0;
  expect_eq<int,int>(local_180 + 1,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x4e);
  undo::UndoHistory::redo((UndoHistory *)local_118);
  local_180[0] = 1;
  expect_eq<int,int>(local_180,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x4f);
  local_181 = false;
  local_182 = undo::UndoHistory::deleteFirstState((UndoHistory *)local_118);
  expect_eq<bool,bool>
            (&local_181,&local_182,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x50);
  main::anon_class_8_1_ba9a1774::operator()(&local_178);
  local_188 = 8;
  expect_eq<int,int>(&local_188,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x51);
  local_189 = true;
  local_18a = undo::UndoHistory::deleteFirstState((UndoHistory *)local_118);
  expect_eq<bool,bool>
            (&local_189,&local_18a,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x57);
  local_1ac[7] = 8;
  expect_eq<int,int>(local_1ac + 7,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x59);
  undo::UndoHistory::undo((UndoHistory *)local_118);
  local_1ac[6] = 7;
  expect_eq<int,int>(local_1ac + 6,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x5a);
  undo::UndoHistory::undo((UndoHistory *)local_118);
  local_1ac[5] = 6;
  expect_eq<int,int>(local_1ac + 5,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x5b);
  undo::UndoHistory::undo((UndoHistory *)local_118);
  local_1ac[4] = 5;
  expect_eq<int,int>(local_1ac + 4,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x5c);
  undo::UndoHistory::undo((UndoHistory *)local_118);
  local_1ac[3] = 4;
  expect_eq<int,int>(local_1ac + 3,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x5d);
  undo::UndoHistory::undo((UndoHistory *)local_118);
  local_1ac[2] = 3;
  expect_eq<int,int>(local_1ac + 2,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x5e);
  undo::UndoHistory::undo((UndoHistory *)local_118);
  local_1ac[1] = 2;
  expect_eq<int,int>(local_1ac + 1,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x5f);
  undo::UndoHistory::undo((UndoHistory *)local_118);
  local_1ac[0] = 1;
  expect_eq<int,int>(local_1ac,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x60);
  local_1ad = false;
  local_1ae = undo::UndoHistory::canUndo((UndoHistory *)local_118);
  expect_eq<bool,bool>
            (&local_1ad,&local_1ae,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x61);
  main::anon_class_8_1_ba9a1774::operator()(&local_178);
  local_1b4 = 8;
  expect_eq<int,int>(&local_1b4,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x62);
  local_1b5 = true;
  local_1b6 = undo::UndoHistory::deleteFirstState((UndoHistory *)local_118);
  expect_eq<bool,bool>
            (&local_1b5,&local_1b6,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x68);
  local_1cc[4] = 8;
  expect_eq<int,int>(local_1cc + 4,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x6a);
  undo::UndoHistory::undo((UndoHistory *)local_118);
  local_1cc[3] = 7;
  expect_eq<int,int>(local_1cc + 3,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x6b);
  undo::UndoHistory::undo((UndoHistory *)local_118);
  local_1cc[2] = 6;
  expect_eq<int,int>(local_1cc + 2,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x6c);
  undo::UndoHistory::undo((UndoHistory *)local_118);
  local_1cc[1] = 5;
  expect_eq<int,int>(local_1cc + 1,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x6d);
  undo::UndoHistory::undo((UndoHistory *)local_118);
  local_1cc[0] = 2;
  expect_eq<int,int>(local_1cc,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x6e);
  local_1cd = false;
  local_1ce = undo::UndoHistory::canUndo((UndoHistory *)local_118);
  expect_eq<bool,bool>
            (&local_1cd,&local_1ce,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x6f);
  main::anon_class_8_1_ba9a1774::operator()(&local_178);
  local_1d4 = 8;
  expect_eq<int,int>(&local_1d4,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x70);
  local_1d5 = true;
  local_1d6 = undo::UndoHistory::deleteFirstState((UndoHistory *)local_118);
  expect_eq<bool,bool>
            (&local_1d5,&local_1d6,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x76);
  local_1e4[2] = 8;
  expect_eq<int,int>(local_1e4 + 2,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x78);
  undo::UndoHistory::undo((UndoHistory *)local_118);
  local_1e4[1] = 7;
  expect_eq<int,int>(local_1e4 + 1,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x79);
  undo::UndoHistory::undo((UndoHistory *)local_118);
  local_1e4[0] = 5;
  expect_eq<int,int>(local_1e4,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x7a);
  local_1e5 = false;
  local_1e6 = undo::UndoHistory::canUndo((UndoHistory *)local_118);
  expect_eq<bool,bool>
            (&local_1e5,&local_1e6,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x7b);
  main::anon_class_8_1_ba9a1774::operator()(&local_178);
  local_1ec = 8;
  expect_eq<int,int>(&local_1ec,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x7c);
  local_1ed = true;
  local_1ee = undo::UndoHistory::deleteFirstState((UndoHistory *)local_118);
  expect_eq<bool,bool>
            (&local_1ed,&local_1ee,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x82);
  local_1f8[1] = 8;
  expect_eq<int,int>(local_1f8 + 1,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x84);
  undo::UndoHistory::undo((UndoHistory *)local_118);
  local_1f8[0] = 7;
  expect_eq<int,int>(local_1f8,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x85);
  local_1f9 = false;
  local_1fa = undo::UndoHistory::canUndo((UndoHistory *)local_118);
  expect_eq<bool,bool>
            (&local_1f9,&local_1fa,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x86);
  undo::UndoHistory::redo((UndoHistory *)local_118);
  local_200 = 8;
  expect_eq<int,int>(&local_200,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x87);
  local_201 = false;
  local_202 = undo::UndoHistory::deleteFirstState((UndoHistory *)local_118);
  expect_eq<bool,bool>
            (&local_201,&local_202,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x8d);
  local_20c[1] = 8;
  expect_eq<int,int>(local_20c + 1,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x8e);
  undo::UndoHistory::undo((UndoHistory *)local_118);
  local_20c[0] = 7;
  expect_eq<int,int>(local_20c,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
                     ,0x8f);
  local_20d = true;
  local_20e = undo::UndoHistory::deleteFirstState((UndoHistory *)local_118);
  expect_eq<bool,bool>
            (&local_20d,&local_20e,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x91);
  local_20f = false;
  local_210 = undo::UndoHistory::canUndo((UndoHistory *)local_118);
  expect_eq<bool,bool>
            (&local_20f,&local_210,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x92);
  local_211 = false;
  local_212 = undo::UndoHistory::canRedo((UndoHistory *)local_118);
  expect_eq<bool,bool>
            (&local_211,&local_212,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/complex_tree.cpp"
             ,0x93);
  undo::UndoHistory::~UndoHistory((UndoHistory *)local_118);
  Cmd::~Cmd((Cmd *)&history.m_cur);
  Cmd::~Cmd((Cmd *)&cmd8.m_redo_value);
  Cmd::~Cmd((Cmd *)&cmd7.m_redo_value);
  Cmd::~Cmd((Cmd *)&cmd6.m_redo_value);
  Cmd::~Cmd((Cmd *)&cmd5.m_redo_value);
  Cmd::~Cmd((Cmd *)&cmd4.m_redo_value);
  Cmd::~Cmd((Cmd *)local_50);
  Cmd::~Cmd((Cmd *)&cmd2.m_redo_value);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
  // 1 --- 2 --- 3 --- 4   -------- 7 --- 8
  //       |              |
  //        ------------- 5 --- 6
  int model = 0;
  Cmd cmd1(model, 1, 0);
  Cmd cmd2(model, 2, 1);
  Cmd cmd3(model, 3, 2);
  Cmd cmd4(model, 4, 3);
  Cmd cmd5(model, 5, 2);
  Cmd cmd6(model, 6, 5);
  Cmd cmd7(model, 7, 5);
  Cmd cmd8(model, 8, 7);

  UndoHistory history;
  cmd1.redo(); history.add(&cmd1);
  cmd2.redo(); history.add(&cmd2);
  cmd3.redo(); history.add(&cmd3);
  cmd4.redo(); history.add(&cmd4);
  history.undo();
  history.undo();
  cmd5.redo(); history.add(&cmd5);
  cmd6.redo(); history.add(&cmd6);
  history.undo();
  cmd7.redo(); history.add(&cmd7);
  cmd8.redo(); history.add(&cmd8);

  EXPECT_EQ(8, model);
  history.undo(); EXPECT_EQ(7, model);
  history.undo(); EXPECT_EQ(6, model);
  history.undo(); EXPECT_EQ(5, model);
  history.undo(); EXPECT_EQ(4, model);
  history.undo(); EXPECT_EQ(3, model);
  history.undo(); EXPECT_EQ(2, model);
  history.undo(); EXPECT_EQ(1, model);
  history.undo(); EXPECT_EQ(0, model);
  EXPECT_FALSE(history.canUndo());

  history.redo(); EXPECT_EQ(1, model);
  history.redo(); EXPECT_EQ(2, model);
  history.redo(); EXPECT_EQ(3, model);
  history.redo(); EXPECT_EQ(4,  model);
  history.redo(); EXPECT_EQ(5,  model);
  history.redo(); EXPECT_EQ(6,  model);
  history.redo(); EXPECT_EQ(7,  model);
  history.redo(); EXPECT_EQ(8,  model);
  EXPECT_FALSE(history.canRedo());

  // Delete states ----------------------------------------

  auto undoAll = [&]{
    while (history.canUndo())
      history.undo();
  };
  auto redoAll = [&]{
    while (history.canRedo())
      history.redo();
  };

  // Cannot delete state 1 if we are in that state
  // 1 --- 2 --- 3 --- 4   -------- 7 --- 8
  //       |              |
  //        ------------- 5 --- 6
  undoAll(); EXPECT_EQ(0, model);
  history.redo(); EXPECT_EQ(1, model);
  EXPECT_FALSE(history.deleteFirstState());
  redoAll(); EXPECT_EQ(8, model);

  // Delete state 1
  // x --- 2 --- 3 --- 4   -------- 7 --- 8
  //       |              |
  //        ------------- 5 --- 6
  EXPECT_TRUE(history.deleteFirstState());

  EXPECT_EQ(8, model);
  history.undo(); EXPECT_EQ(7, model);
  history.undo(); EXPECT_EQ(6, model);
  history.undo(); EXPECT_EQ(5, model);
  history.undo(); EXPECT_EQ(4, model);
  history.undo(); EXPECT_EQ(3, model);
  history.undo(); EXPECT_EQ(2, model);
  history.undo(); EXPECT_EQ(1, model);
  EXPECT_FALSE(history.canUndo());
  redoAll(); EXPECT_EQ(8, model);

  // Delete state 2 (we cannot go back to 3 or 4 from 5 because 2 is gone)
  // x --- x --- x --- x   -------- 7 --- 8
  //       |              |
  //        ------------- 5 --- 6
  EXPECT_TRUE(history.deleteFirstState());

  EXPECT_EQ(8, model);
  history.undo(); EXPECT_EQ(7, model);
  history.undo(); EXPECT_EQ(6, model);
  history.undo(); EXPECT_EQ(5, model);
  history.undo(); EXPECT_EQ(2, model);
  EXPECT_FALSE(history.canUndo());
  redoAll(); EXPECT_EQ(8, model);

  // Delete state 5 (we cannot go back to 6 from 7 because 5 is gone)
  // x --- x --- x --- x   -------- 7 --- 8
  //       |              |
  //        ------------- x --- x
  EXPECT_TRUE(history.deleteFirstState());

  EXPECT_EQ(8, model);
  history.undo(); EXPECT_EQ(7, model);
  history.undo(); EXPECT_EQ(5, model);
  EXPECT_FALSE(history.canUndo());
  redoAll(); EXPECT_EQ(8, model);

  // Delete state 7
  // x --- x --- x --- x   -------- x --- 8
  //       |              |
  //        ------------- x --- x
  EXPECT_TRUE(history.deleteFirstState());

  EXPECT_EQ(8, model);
  history.undo(); EXPECT_EQ(7, model);
  EXPECT_FALSE(history.canUndo());
  history.redo(); EXPECT_EQ(8, model);

  // Cannot delete state 8 because is the current state
  // x --- x --- x --- x   -------- x --- 8
  //       |              |
  //        ------------- x --- x
  EXPECT_FALSE(history.deleteFirstState());
  EXPECT_EQ(8, model);
  history.undo(); EXPECT_EQ(7, model);
  // Now we can delete the whole history
  EXPECT_TRUE(history.deleteFirstState());
  EXPECT_FALSE(history.canUndo());
  EXPECT_FALSE(history.canRedo());
}